

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Operation<int,int,duckdb::ArgMinMaxState<int,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (ArgMinMaxState<int,_int> *state,int *x,int *y,AggregateBinaryInput *binary)

{
  bool bVar1;
  ArgMinMaxState<int,_int> *in_RCX;
  TemplatedValidityMask<unsigned_long> *in_RDX;
  int *in_RSI;
  byte *in_RDI;
  AggregateBinaryInput *in_stack_ffffffffffffffd0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffd8;
  
  if ((*in_RDI & 1) == 0) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffffd8,(idx_t)in_stack_ffffffffffffffd0);
    if (bVar1) {
      TemplatedValidityMask<unsigned_long>::RowIsValid(in_RDX,(idx_t)in_RSI);
      Assign<int,int,duckdb::ArgMinMaxState<int,int>>
                (in_RCX,(int *)in_RDX,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
      *in_RDI = 1;
    }
  }
  else {
    Execute<int,int,duckdb::ArgMinMaxState<int,int>>
              (in_RCX,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8
               ,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}